

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall
VariationalBayesEstimatorOnLDA::writeVariationalLowerBound
          (VariationalBayesEstimatorOnLDA *this,string *VLBFilename,string *VLBTimeSeriesFilename)

{
  _Setprecision _Var1;
  ostream *this_00;
  size_type sVar2;
  const_reference pvVar3;
  int local_438;
  int i;
  string local_420 [8];
  ofstream VLBTimeSeriesOutput;
  string local_220 [8];
  ofstream VLBOutput;
  string *VLBTimeSeriesFilename_local;
  string *VLBFilename_local;
  VariationalBayesEstimatorOnLDA *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::ofstream(local_420);
  std::ofstream::open(local_220,(_Ios_Openmode)VLBFilename);
  std::ofstream::open(local_420,(_Ios_Openmode)VLBTimeSeriesFilename);
  _Var1 = std::setprecision(0x11);
  std::operator<<((ostream *)local_220,_Var1);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)local_220,this->_variationalLowerBound);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setprecision(0x11);
  std::operator<<((ostream *)local_420,_Var1);
  local_438 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(&this->_VLBTimeSeries);
    if (sVar2 <= (ulong)(long)local_438) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->_VLBTimeSeries,(long)local_438);
    std::ostream::operator<<((ostream *)local_420,*pvVar3);
    std::ostream::operator<<((ostream *)local_420,std::endl<char,std::char_traits<char>>);
    local_438 = local_438 + 1;
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(local_420);
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::writeVariationalLowerBound(string VLBFilename, string VLBTimeSeriesFilename)const{//{{{
    ofstream VLBOutput;
    ofstream VLBTimeSeriesOutput;
    VLBOutput.open(VLBFilename, ios::out);
    VLBTimeSeriesOutput.open(VLBTimeSeriesFilename, ios::out);

    VLBOutput<<setprecision(numeric_limits<double>::max_digits10);
    VLBOutput<<_variationalLowerBound<<endl;
    VLBTimeSeriesOutput<<std::setprecision(std::numeric_limits<double>::max_digits10);
    for(int i=0;i<_VLBTimeSeries.size();i++){
        VLBTimeSeriesOutput<<_VLBTimeSeries[i];
        VLBTimeSeriesOutput<<endl;
    }
    VLBOutput.close();
    VLBTimeSeriesOutput.close();
}